

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_literals.c
# Opt level: O1

size_t ZSTD_compressLiterals
                 (ZSTD_hufCTables_t *prevHuf,ZSTD_hufCTables_t *nextHuf,ZSTD_strategy strategy,
                 int disableLiteralCompression,void *dst,size_t dstCapacity,void *src,size_t srcSize
                 ,void *entropyWorkspace,size_t entropyWorkspaceSize,int bmi2)

{
  uint *dst_00;
  size_t sVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  size_t dstSize;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  bool bVar11;
  HUF_repeat repeat;
  ZSTD_hufCTables_t *local_80;
  void *local_78;
  uint *local_70;
  long local_68;
  ulong local_60;
  ulong local_58;
  void *local_50;
  size_t local_48;
  ulong local_40;
  ulong local_38;
  
  local_68 = CONCAT44(local_68._4_4_,disableLiteralCompression);
  uVar8 = (ulong)strategy;
  local_58 = (ulong)(uint)bmi2;
  local_48 = entropyWorkspaceSize;
  bVar2 = 6;
  if (ZSTD_btopt < strategy) {
    bVar2 = (char)strategy - 1;
  }
  uVar6 = srcSize >> (bVar2 & 0x3f);
  local_50 = entropyWorkspace;
  lVar10 = ((ulong)(0x3ff < srcSize) + 1) - (ulong)(srcSize < 0x4000);
  local_80 = nextHuf;
  local_70 = (uint *)dst;
  local_60 = dstCapacity;
  memcpy(nextHuf,prevHuf,0x404);
  dst_00 = local_70;
  if ((int)local_68 == 0) {
    local_78 = src;
    uVar7 = 0x3f;
    if (prevHuf->repeatMode == HUF_repeat_valid) {
      uVar7 = 6;
    }
    local_68 = lVar10;
    local_40 = uVar8;
    local_38 = uVar6;
    if (uVar7 < srcSize) {
      uVar8 = lVar10 + 3;
      sVar1 = 0xffffffffffffffba;
      dstSize = local_60 - uVar8;
      if (uVar8 <= local_60 && dstSize != 0) {
        repeat = prevHuf->repeatMode;
        bVar5 = srcSize < 0x401 && strategy < ZSTD_lazy;
        bVar11 = repeat == HUF_repeat_valid;
        if (uVar8 == 3 && bVar11 || srcSize < 0x100) {
          uVar6 = HUF_compress1X_repeat
                            ((void *)((long)local_70 + uVar8),dstSize,src,srcSize,0xff,0xb,local_50,
                             local_48,local_80->CTable,&repeat,(uint)bVar5,(int)local_58);
        }
        else {
          uVar6 = HUF_compress4X_repeat
                            ((void *)((long)local_70 + uVar8),dstSize,src,srcSize,0xff,0xb,local_50,
                             local_48,local_80->CTable,&repeat,(uint)bVar5,(int)local_58);
        }
        uVar3 = 3 - (repeat == HUF_repeat_none);
        if ((uVar6 - 1 < 0xffffffffffffff88) && (uVar6 < (srcSize - local_38) - 2)) {
          if (uVar6 == 1) {
            memcpy(local_80,prevHuf,0x404);
            sVar1 = ZSTD_compressRleLiteralsBlock(dst_00,(size_t)prevHuf,src,srcSize);
          }
          else {
            if (repeat == HUF_repeat_none) {
              local_80->repeatMode = HUF_repeat_check;
            }
            iVar9 = (int)srcSize;
            iVar4 = (int)uVar6;
            if (uVar8 == 5) {
              *dst_00 = iVar4 * 0x400000 + iVar9 * 0x10 | uVar3 | 0xc;
              *(char *)(dst_00 + 1) = (char)(uVar6 >> 10);
            }
            else if (uVar8 == 4) {
              *dst_00 = iVar4 * 0x40000 + iVar9 * 0x10 | uVar3 | 8;
            }
            else {
              iVar4 = iVar4 * 0x4000 +
                      ((uVar3 | iVar9 * 0x10 + (uint)(uVar8 == 3 && bVar11 || srcSize < 0x100) * 4)
                      ^ 4);
              *(short *)dst_00 = (short)iVar4;
              *(char *)((long)dst_00 + 2) = (char)((uint)iVar4 >> 0x10);
            }
            sVar1 = uVar6 + uVar8;
          }
        }
        else {
          memcpy(local_80,prevHuf,0x404);
          sVar1 = ZSTD_noCompressLiterals(dst_00,local_60,src,srcSize);
        }
      }
    }
    else {
      sVar1 = ZSTD_noCompressLiterals(local_70,local_60,src,srcSize);
    }
    return sVar1;
  }
  sVar1 = ZSTD_noCompressLiterals(local_70,local_60,src,srcSize);
  return sVar1;
}

Assistant:

size_t ZSTD_compressLiterals (ZSTD_hufCTables_t const* prevHuf,
                              ZSTD_hufCTables_t* nextHuf,
                              ZSTD_strategy strategy, int disableLiteralCompression,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize,
                              void* entropyWorkspace, size_t entropyWorkspaceSize,
                        const int bmi2)
{
    size_t const minGain = ZSTD_minGain(srcSize, strategy);
    size_t const lhSize = 3 + (srcSize >= 1 KB) + (srcSize >= 16 KB);
    BYTE*  const ostart = (BYTE*)dst;
    U32 singleStream = srcSize < 256;
    symbolEncodingType_e hType = set_compressed;
    size_t cLitSize;

    DEBUGLOG(5,"ZSTD_compressLiterals (disableLiteralCompression=%i srcSize=%u)",
                disableLiteralCompression, (U32)srcSize);

    /* Prepare nextEntropy assuming reusing the existing table */
    ZSTD_memcpy(nextHuf, prevHuf, sizeof(*prevHuf));

    if (disableLiteralCompression)
        return ZSTD_noCompressLiterals(dst, dstCapacity, src, srcSize);

    /* small ? don't even attempt compression (speed opt) */
#   define COMPRESS_LITERALS_SIZE_MIN 63
    {   size_t const minLitSize = (prevHuf->repeatMode == HUF_repeat_valid) ? 6 : COMPRESS_LITERALS_SIZE_MIN;
        if (srcSize <= minLitSize) return ZSTD_noCompressLiterals(dst, dstCapacity, src, srcSize);
    }

    RETURN_ERROR_IF(dstCapacity < lhSize+1, dstSize_tooSmall, "not enough space for compression");
    {   HUF_repeat repeat = prevHuf->repeatMode;
        int const preferRepeat = strategy < ZSTD_lazy ? srcSize <= 1024 : 0;
        if (repeat == HUF_repeat_valid && lhSize == 3) singleStream = 1;
        cLitSize = singleStream ?
            HUF_compress1X_repeat(
                ostart+lhSize, dstCapacity-lhSize, src, srcSize,
                HUF_SYMBOLVALUE_MAX, HUF_TABLELOG_DEFAULT, entropyWorkspace, entropyWorkspaceSize,
                (HUF_CElt*)nextHuf->CTable, &repeat, preferRepeat, bmi2) :
            HUF_compress4X_repeat(
                ostart+lhSize, dstCapacity-lhSize, src, srcSize,
                HUF_SYMBOLVALUE_MAX, HUF_TABLELOG_DEFAULT, entropyWorkspace, entropyWorkspaceSize,
                (HUF_CElt*)nextHuf->CTable, &repeat, preferRepeat, bmi2);
        if (repeat != HUF_repeat_none) {
            /* reused the existing table */
            DEBUGLOG(5, "Reusing previous huffman table");
            hType = set_repeat;
        }
    }

    if ((cLitSize==0) || (cLitSize >= srcSize - minGain) || ERR_isError(cLitSize)) {
        ZSTD_memcpy(nextHuf, prevHuf, sizeof(*prevHuf));
        return ZSTD_noCompressLiterals(dst, dstCapacity, src, srcSize);
    }
    if (cLitSize==1) {
        ZSTD_memcpy(nextHuf, prevHuf, sizeof(*prevHuf));
        return ZSTD_compressRleLiteralsBlock(dst, dstCapacity, src, srcSize);
    }

    if (hType == set_compressed) {
        /* using a newly constructed table */
        nextHuf->repeatMode = HUF_repeat_check;
    }

    /* Build header */
    switch(lhSize)
    {
    case 3: /* 2 - 2 - 10 - 10 */
        {   U32 const lhc = hType + ((!singleStream) << 2) + ((U32)srcSize<<4) + ((U32)cLitSize<<14);
            MEM_writeLE24(ostart, lhc);
            break;
        }
    case 4: /* 2 - 2 - 14 - 14 */
        {   U32 const lhc = hType + (2 << 2) + ((U32)srcSize<<4) + ((U32)cLitSize<<18);
            MEM_writeLE32(ostart, lhc);
            break;
        }
    case 5: /* 2 - 2 - 18 - 18 */
        {   U32 const lhc = hType + (3 << 2) + ((U32)srcSize<<4) + ((U32)cLitSize<<22);
            MEM_writeLE32(ostart, lhc);
            ostart[4] = (BYTE)(cLitSize >> 10);
            break;
        }
    default:  /* not possible : lhSize is {3,4,5} */
        assert(0);
    }
    DEBUGLOG(5, "Compressed literals: %u -> %u", (U32)srcSize, (U32)(lhSize+cLitSize));
    return lhSize+cLitSize;
}